

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseSimdV128Const
          (WastParser *this,Const *const_,TokenType token_type,ConstType const_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  Const *pCVar1;
  bool bVar2;
  TokenType TVar3;
  uint32_t x;
  ExpectedNan nan;
  char *pcVar4;
  Literal *pLVar5;
  uint64_t x_00;
  string *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_300;
  string local_2d8;
  size_type local_2b8;
  Enum local_294;
  Enum local_290;
  Enum local_28c;
  undefined1 local_288 [8];
  Const lane_const_;
  uint64_t local_238;
  uint64_t value_3;
  Enum local_228;
  uint32_t value_2;
  Enum local_220;
  uint16_t value_1;
  const_iterator pcStack_218;
  uint8_t value;
  char *end;
  char *s;
  undefined1 auStack_1c8 [8];
  string_view sv;
  Result result;
  iterator local_190;
  size_type local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_162;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  iterator local_140;
  size_type local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined1 local_118 [8];
  Token token;
  Location loc;
  undefined1 auStack_b0 [4];
  int lane;
  size_type local_a8;
  anon_union_16_2_ecfd7102_for_Location_1 local_a0;
  Token local_90;
  char *local_50;
  size_type local_48;
  size_t local_40;
  undefined8 local_38;
  byte local_2a;
  byte local_29;
  ConstType local_28;
  bool integer;
  TokenType TStack_24;
  uint8_t lane_count;
  ConstType const_type_local;
  TokenType token_type_local;
  Const *const__local;
  WastParser *this_local;
  
  local_29 = 0;
  local_2a = 1;
  local_28 = const_type;
  TStack_24 = token_type;
  _const_type_local = const_;
  const__local = (Const *)this;
  switch(token_type) {
  case I8X16:
    local_29 = 0x10;
    break;
  case I16X8:
    local_29 = 8;
    break;
  case I32X4:
    local_29 = 4;
    break;
  case I64X2:
    local_29 = 2;
    break;
  case F32X4:
    local_29 = 4;
    local_2a = 0;
    break;
  case F64X2:
    local_29 = 2;
    local_2a = 0;
    break;
  default:
    local_50 = (const_->loc).filename.data_;
    local_48 = (const_->loc).filename.size_;
    local_40 = (const_->loc).field_1.field_1.offset;
    local_38 = *(undefined8 *)((long)&(const_->loc).field_1 + 8);
    pcVar4 = GetTokenTypeName(token_type);
    Error(this,0x4eb561,pcVar4);
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  Consume(&local_90,this);
  GetLocation((Location *)auStack_b0,this);
  (_const_type_local->loc).filename.data_ = _auStack_b0;
  (_const_type_local->loc).filename.size_ = local_a8;
  (_const_type_local->loc).field_1.field_1.offset = (size_t)local_a0.field_1.offset;
  *(undefined8 *)((long)&(_const_type_local->loc).field_1 + 8) = local_a0._8_8_;
  loc.field_1._12_4_ = 0;
  do {
    if ((int)(uint)local_29 <= (int)loc.field_1._12_4_) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    GetLocation((Location *)&token.field_2.literal_.text.size_,this);
    GetToken((Token *)local_118,this);
    TVar3 = Token::token_type((Token *)local_118);
    if ((TVar3 - NanArithmetic < 2) || (TVar3 == First_Literal)) {
      if ((local_2a & 1) != 0) goto LAB_0041994d;
    }
    else if (TVar3 != Int && TVar3 != Last_Literal) {
LAB_0041994d:
      if ((local_2a & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_160,"a Nat or Integer literal",&local_161);
        local_140 = &local_160;
        local_138 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_162);
        __l_00._M_len = local_138;
        __l_00._M_array = local_140;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_130,__l_00,&local_162);
        this_local._4_4_ = ErrorExpected(this,&local_130,"123");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_130);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_162);
        local_300 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140;
        do {
          local_300 = local_300 + -1;
          std::__cxx11::string::~string((string *)local_300);
        } while (local_300 != &local_160);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        return (Result)this_local._4_4_;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&result,"a Float literal",(allocator *)((long)&sv.size_ + 7));
      local_190 = (iterator)&result;
      local_188 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&sv.size_ + 6));
      __l._M_len = local_188;
      __l._M_array = local_190;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_180,__l,(allocator_type *)((long)&sv.size_ + 6));
      this_local._4_4_ = ErrorExpected(this,&local_180,"42.0");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_180);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&sv.size_ + 6));
      local_318 = (string *)&local_190;
      do {
        local_318 = local_318 + -0x20;
        std::__cxx11::string::~string(local_318);
      } while (local_318 != (string *)&result);
      std::allocator<char>::~allocator((allocator<char> *)((long)&sv.size_ + 7));
      return (Result)this_local._4_4_;
    }
    Result::Result((Result *)&sv.size_);
    if ((local_2a & 1) == 0) {
      Const::Const((Const *)local_288);
      if (local_29 == 2) {
        local_290 = (Enum)ParseF64(this,(Const *)local_288,local_28);
        pCVar1 = _const_type_local;
        sv.size_._0_4_ = (Result)local_290;
        x_00 = Const::f64_bits((Const *)local_288);
        Const::set_v128_f64(pCVar1,loc.field_1._12_4_,x_00);
      }
      else if (local_29 == 4) {
        local_28c = (Enum)ParseF32(this,(Const *)local_288,local_28);
        pCVar1 = _const_type_local;
        sv.size_._0_4_ = (Result)local_28c;
        x = Const::f32_bits((Const *)local_288);
        Const::set_v128_f32(pCVar1,loc.field_1._12_4_,x);
      }
      pCVar1 = _const_type_local;
      nan = Const::expected_nan((Const *)local_288,0);
      Const::set_expected_nan(pCVar1,loc.field_1._12_4_,nan);
    }
    else {
      Consume((Token *)&s,this);
      pLVar5 = Token::literal((Token *)&s);
      auStack_1c8 = (undefined1  [8])(pLVar5->text).data_;
      sv.data_ = (char *)(pLVar5->text).size_;
      end = string_view::begin((string_view *)auStack_1c8);
      pcStack_218 = string_view::end((string_view *)auStack_1c8);
      switch(local_29) {
      case 2:
        local_238 = 0;
        lane_const_.nan_[3] = (ExpectedNan)ParseInt64(end,pcStack_218,&local_238,SignedAndUnsigned);
        sv.size_._0_4_ = (Result)lane_const_.nan_[3];
        Const::set_v128_u64(_const_type_local,loc.field_1._12_4_,local_238);
        break;
      case 4:
        value_3._4_4_ = 0;
        value_3._0_4_ =
             ParseInt32(end,pcStack_218,(uint32_t *)((long)&value_3 + 4),SignedAndUnsigned);
        sv.size_._0_4_ = value_3._0_4_;
        Const::set_v128_u32(_const_type_local,loc.field_1._12_4_,value_3._4_4_);
        break;
      case 8:
        value_2._2_2_ = 0;
        local_228 = (Enum)ParseInt16(end,pcStack_218,(uint16_t *)((long)&value_2 + 2),
                                     SignedAndUnsigned);
        sv.size_._0_4_ = (Result)local_228;
        Const::set_v128_u16(_const_type_local,loc.field_1._12_4_,value_2._2_2_);
        break;
      case 0x10:
        value_1._1_1_ = '\0';
        local_220 = (Enum)ParseInt8(end,pcStack_218,(uint8_t *)((long)&value_1 + 1),
                                    SignedAndUnsigned);
        sv.size_._0_4_ = (Result)local_220;
        Const::set_v128_u8(_const_type_local,loc.field_1._12_4_,value_1._1_1_);
      }
    }
    local_294 = sv.size_._0_4_;
    bVar2 = Failed(sv.size_._0_4_);
    if (bVar2) {
      local_2b8 = token.field_2.literal_.text.size_;
      Token::to_string_abi_cxx11_(&local_2d8,(Token *)local_118);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      Error(this,0x4eb601,pcVar4);
      std::__cxx11::string::~string((string *)&local_2d8);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    loc.field_1._12_4_ = loc.field_1._12_4_ + 1;
  } while( true );
}

Assistant:

Result WastParser::ParseSimdV128Const(Const* const_,
                                      TokenType token_type,
                                      ConstType const_type) {
  WABT_TRACE(ParseSimdV128Const);

  uint8_t lane_count = 0;
  bool integer = true;
  switch (token_type) {
    case TokenType::I8X16: { lane_count = 16; break; }
    case TokenType::I16X8: { lane_count = 8; break; }
    case TokenType::I32X4: { lane_count = 4; break; }
    case TokenType::I64X2: { lane_count = 2; break; }
    case TokenType::F32X4: { lane_count = 4; integer = false; break; }
    case TokenType::F64X2: { lane_count = 2; integer = false; break; }
    default: {
      Error(
        const_->loc,
        "Unexpected type at start of simd constant. "
        "Expected one of: i8x16, i16x8, i32x4, i64x2, f32x4, f64x2. "
        "Found \"%s\".",
        GetTokenTypeName(token_type)
      );
      return Result::Error;
    }
  }
  Consume();

  const_->loc = GetLocation();

  for (int lane = 0; lane < lane_count; ++lane) {
    Location loc = GetLocation();

    // Check that the lane literal type matches the element type of the v128:
    Token token = GetToken();
    switch (token.token_type()) {
      case TokenType::Nat:
      case TokenType::Int:
        // OK.
        break;

      case TokenType::Float:
      case TokenType::NanArithmetic:
      case TokenType::NanCanonical:
        if (integer) {
          goto error;
        }
        break;

      error:
      default:
        if (integer) {
          return ErrorExpected({"a Nat or Integer literal"}, "123");
        } else {
          return ErrorExpected({"a Float literal"}, "42.0");
        }
    }

    Result result;

    // For each type, parse the next literal, bound check it, and write it to
    // the array of bytes:
    if (integer) {
      string_view sv = Consume().literal().text;
      const char* s = sv.begin();
      const char* end = sv.end();

      switch (lane_count) {
        case 16: {
          uint8_t value = 0;
          result = ParseInt8(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u8(lane, value);
          break;
        }
        case 8: {
          uint16_t value = 0;
          result = ParseInt16(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u16(lane, value);
          break;
        }
        case 4: {
          uint32_t value = 0;
          result = ParseInt32(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u32(lane, value);
          break;
        }
        case 2: {
          uint64_t value = 0;
          result = ParseInt64(s, end, &value, ParseIntType::SignedAndUnsigned);
          const_->set_v128_u64(lane, value);
          break;
        }
      }
    } else {
      Const lane_const_;
      switch (lane_count) {
        case 4:
          result = ParseF32(&lane_const_, const_type);
          const_->set_v128_f32(lane, lane_const_.f32_bits());
          break;

        case 2:
          result = ParseF64(&lane_const_, const_type);
          const_->set_v128_f64(lane, lane_const_.f64_bits());
          break;
      }

      const_->set_expected_nan(lane, lane_const_.expected_nan());
    }

    if (Failed(result)) {
      Error(loc, "invalid literal \"%s\"", token.to_string().c_str());
      return Result::Error;
    }
  }

  return Result::Ok;
}